

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O3

Maybe<unsigned_long_long> __thiscall
kj::anon_unknown_55::tryParseUnsigned(anon_unknown_55 *this,StringPtr *s,unsigned_long_long max)

{
  char *pcVar1;
  ulonglong in_RAX;
  int *piVar2;
  int __base;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long_long>_2 aVar3;
  Maybe<unsigned_long_long> MVar4;
  char *endPtr;
  char *local_30;
  
  aVar3.value = max;
  if (1 < (s->content).size_) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar1 = (s->content).ptr;
    __base = 10;
    if (pcVar1[*pcVar1 == '-'] == '0') {
      __base = 10;
      if ((pcVar1[(ulong)(*pcVar1 == '-') + 1] & 0xdfU) == 0x58) {
        __base = 0x10;
      }
    }
    in_RAX = strtoull(pcVar1,&local_30,__base);
    pcVar1 = (s->content).ptr;
    aVar3.value = (long)pcVar1 + ((s->content).size_ - 1);
    if ((((local_30 == (char *)aVar3.value) && (*piVar2 != 0x22)) && (in_RAX <= max)) &&
       (*pcVar1 != '-')) {
      *this = (anon_unknown_55)0x1;
      *(ulonglong *)(this + 8) = in_RAX;
      goto LAB_0044cc97;
    }
  }
  *this = (anon_unknown_55)0x0;
LAB_0044cc97:
  MVar4.ptr.field_1.value = aVar3.value;
  MVar4.ptr._0_8_ = in_RAX;
  return (Maybe<unsigned_long_long>)MVar4.ptr;
}

Assistant:

Maybe<unsigned long long> tryParseUnsigned(const StringPtr& s, unsigned long long max) {
  if (s == nullptr) { return kj::none; } // String does not contain valid number.
  char *endPtr;
  errno = 0;
  auto value = strtoull(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  if (endPtr != s.end() || errno == ERANGE || max < value || s[0] == '-') { return kj::none; }
  return value;
}